

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::TypeName_abi_cxx11_
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this)

{
  string *in_RDI;
  
  pzgeom::TPZQuadraticPrism::TypeName_abi_cxx11_();
  return in_RDI;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }